

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O0

bool __thiscall ON_UuidPairList2::FindId1(ON_UuidPairList2 *this,ON_UUID *id1,ON_UUID *id2)

{
  bool bVar1;
  unordered_map<ON_UUID_struct,_ON_UUID_struct,_ON_UuidList2_Private<ON_UUID_struct>::UuidHasher,_std::equal_to<ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_ON_UUID_struct>_>_>
  *puVar2;
  pointer ppVar3;
  _Node_iterator_base<std::pair<const_ON_UUID_struct,_ON_UUID_struct>,_true> local_38;
  _Node_iterator_base<std::pair<const_ON_UUID_struct,_ON_UUID_struct>,_true> local_30;
  iterator it;
  ON_UUID *id2_local;
  ON_UUID *id1_local;
  ON_UuidPairList2 *this_local;
  
  it.super__Node_iterator_base<std::pair<const_ON_UUID_struct,_ON_UUID_struct>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_ON_UUID_struct,_ON_UUID_struct>,_true>)
       (_Node_iterator_base<std::pair<const_ON_UUID_struct,_ON_UUID_struct>,_true>)id2;
  puVar2 = (unordered_map<ON_UUID_struct,_ON_UUID_struct,_ON_UuidList2_Private<ON_UUID_struct>::UuidHasher,_std::equal_to<ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_ON_UUID_struct>_>_>
            *)std::
              unique_ptr<ON_UuidPairList2_Private,_std::default_delete<ON_UuidPairList2_Private>_>::
              operator->(&this->m_private);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<ON_UUID_struct,_ON_UUID_struct,_ON_UuidList2_Private<ON_UUID_struct>::UuidHasher,_std::equal_to<ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_ON_UUID_struct>_>_>
       ::find(puVar2,id1);
  puVar2 = (unordered_map<ON_UUID_struct,_ON_UUID_struct,_ON_UuidList2_Private<ON_UUID_struct>::UuidHasher,_std::equal_to<ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_ON_UUID_struct>_>_>
            *)std::
              unique_ptr<ON_UuidPairList2_Private,_std::default_delete<ON_UuidPairList2_Private>_>::
              operator->(&this->m_private);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<ON_UUID_struct,_ON_UUID_struct,_ON_UuidList2_Private<ON_UUID_struct>::UuidHasher,_std::equal_to<ON_UUID_struct>,_std::allocator<std::pair<const_ON_UUID_struct,_ON_UUID_struct>_>_>
       ::end(puVar2);
  bVar1 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar1) {
    if (it.super__Node_iterator_base<std::pair<const_ON_UUID_struct,_ON_UUID_struct>,_true>._M_cur
        != (__node_type *)0x0) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_ON_UUID_struct,_ON_UUID_struct>,_false,_true>::
               operator->((_Node_iterator<std::pair<const_ON_UUID_struct,_ON_UUID_struct>,_false,_true>
                           *)&local_30);
      *(undefined8 *)
       it.super__Node_iterator_base<std::pair<const_ON_UUID_struct,_ON_UUID_struct>,_true>._M_cur =
           *(undefined8 *)&ppVar3->second;
      *(undefined8 *)
       ((long)it.super__Node_iterator_base<std::pair<const_ON_UUID_struct,_ON_UUID_struct>,_true>.
              _M_cur + 8) = *(undefined8 *)(ppVar3->second).Data4;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_UuidPairList2::FindId1(const ON_UUID& id1, ON_UUID* id2) const
{
  const auto it = m_private->map.find(id1);

  if (it != m_private->map.end())
  {
    if (id2)
    {
      *id2 = it->second;
    }
    return true;
  }
  return false;
}